

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O3

int ndn_name_append_name(ndn_name_t *lhs,ndn_name_t *rhs)

{
  name_component_t *pnVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  uint32_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  int iVar12;
  byte bVar13;
  ndn_name_t *pnVar14;
  ulong uVar15;
  
  bVar13 = lhs->components_size;
  iVar12 = -10;
  if ((uint)rhs->components_size + (uint)bVar13 < 0xb) {
    if (rhs->components_size == 0) {
      return 0;
    }
    iVar12 = 0;
    uVar15 = 0;
    pnVar14 = rhs;
    do {
      uVar7 = pnVar14->components[0].type;
      uVar8 = pnVar14->components[0].value[0];
      uVar9 = pnVar14->components[0].value[1];
      uVar10 = pnVar14->components[0].value[2];
      uVar11 = pnVar14->components[0].value[3];
      uVar2 = *(undefined8 *)(pnVar14->components[0].value + 4);
      uVar3 = *(undefined8 *)(pnVar14->components[0].value + 0xc);
      uVar4 = *(undefined8 *)(pnVar14->components[0].value + 0x14);
      uVar5 = *(undefined8 *)(pnVar14->components[0].value + 0x20);
      puVar6 = lhs->components[bVar13].value;
      *(undefined8 *)(puVar6 + 0x18) = *(undefined8 *)(pnVar14->components[0].value + 0x18);
      *(undefined8 *)(puVar6 + 0x20) = uVar5;
      puVar6 = lhs->components[bVar13].value;
      *(undefined8 *)(puVar6 + 0xc) = uVar3;
      *(undefined8 *)(puVar6 + 0x14) = uVar4;
      pnVar1 = lhs->components + bVar13;
      pnVar1->type = uVar7;
      pnVar1->value[0] = uVar8;
      pnVar1->value[1] = uVar9;
      pnVar1->value[2] = uVar10;
      pnVar1->value[3] = uVar11;
      *(undefined8 *)(pnVar1->value + 4) = uVar2;
      bVar13 = lhs->components_size + 1;
      lhs->components_size = bVar13;
      uVar15 = uVar15 + 1;
      pnVar14 = (ndn_name_t *)(pnVar14->components + 1);
    } while (uVar15 < rhs->components_size);
  }
  return iVar12;
}

Assistant:

int
ndn_name_append_name(ndn_name_t* lhs, const ndn_name_t* rhs)
{
  if (lhs->components_size + rhs->components_size <= NDN_NAME_COMPONENTS_SIZE) {
    for (int i = 0; i < rhs->components_size; i++) {
      memcpy(&lhs->components[lhs->components_size], &rhs->components[i], sizeof(name_component_t));
      lhs->components_size++;
    }
    return 0;
  }
  else
    return NDN_OVERSIZE;
}